

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_filename.c
# Opt level: O2

void test_read_format_zip_filename_CP932_CP932(void)

{
  int iVar1;
  wchar_t wVar2;
  char *pcVar3;
  archive_conflict *a;
  la_int64_t lVar4;
  archive_entry *ae;
  
  pcVar3 = setlocale(6,"Japanese_Japan");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = setlocale(6,"ja_JP.SJIS");
    if (pcVar3 == (char *)0x0) {
      skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                     ,L'˰');
      test_skipping("CP932 locale not available on this system.");
      return;
    }
  }
  extract_reference_file("test_read_format_zip_filename_cp932.zip");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                   ,L'˵',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                      ,L'˶',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                      ,L'˷',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_all(a)",a);
  iVar1 = archive_read_set_options((archive *)a,"hdrcharset=CP932");
  if (iVar1 == 0) {
    wVar2 = archive_read_open_filename(a,"test_read_format_zip_filename_cp932.zip",0x2800);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'˾',0,"ARCHIVE_OK",(long)wVar2,
                        "archive_read_open_filename(a, refname, 10240)",a);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'́',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar3 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
               ,L'̄',anon_var_dwarf_c5448,
               "\"\\x95\\x5c\\x82\\xbe\\x82\\xe6\\x2f\\x88\\xea\\x97\\x97\\x95\\x5c.txt\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_size(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̅',5,"5",lVar4,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̆',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̇',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̊',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    pcVar3 = archive_entry_pathname(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
               ,L'̍',anon_var_dwarf_c546a,
               "\"\\x95\\x5c\\x82\\xbe\\x82\\xe6\\x2f\\x8a\\xbf\\x8e\\x9a.txt\"",pcVar3,
               "archive_entry_pathname(ae)",(void *)0x0,L'\0');
    lVar4 = archive_entry_size(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̎',5,"5",lVar4,"archive_entry_size(ae)",(void *)0x0);
    wVar2 = archive_entry_is_encrypted(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̏',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
    iVar1 = archive_read_has_encrypted_entries((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̐',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
    iVar1 = archive_read_next_header((archive *)a,&ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̔',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",a);
    iVar1 = archive_filter_code((archive *)a,0);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̗',0,"ARCHIVE_FILTER_NONE",(long)iVar1,"archive_filter_code(a, 0)",a);
    iVar1 = archive_format((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̘',0x50000,"ARCHIVE_FORMAT_ZIP",(long)iVar1,"archive_format(a)",a);
    iVar1 = archive_read_close((archive *)a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                        ,L'̛',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",(void *)0x0);
  }
  else {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                   ,L'˹');
    test_skipping("This system cannot convert character-set from CP932.");
  }
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_zip_filename.c"
                      ,L'̝',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_filename_CP932_CP932)
{
	const char *refname = "test_read_format_zip_filename_cp932.zip";
	struct archive *a;
	struct archive_entry *ae;

	/*
	 * Read CP932 filename in CP932/SJIS with "hdrcharset=CP932" option.
	 */
	if (NULL == setlocale(LC_ALL, "Japanese_Japan") &&
	    NULL == setlocale(LC_ALL, "ja_JP.SJIS")) {
		skipping("CP932 locale not available on this system.");
		return;
	}
	extract_reference_file(refname);

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	if (ARCHIVE_OK != archive_read_set_options(a, "hdrcharset=CP932")) {
		skipping("This system cannot convert character-set"
		    " from CP932.");
		goto cleanup;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(
		"\x95\x5c\x82\xbe\x82\xe6\x2f\x88\xea\x97\x97\x95\x5c.txt",
	    archive_entry_pathname(ae));
	assertEqualInt(5, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

	/* Verify regular file. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assertEqualString(
		"\x95\x5c\x82\xbe\x82\xe6\x2f\x8a\xbf\x8e\x9a.txt",
	    archive_entry_pathname(ae));
	assertEqualInt(5, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);


	/* End of archive. */
	assertEqualIntA(a, ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualIntA(a, ARCHIVE_FILTER_NONE, archive_filter_code(a, 0));
	assertEqualIntA(a, ARCHIVE_FORMAT_ZIP, archive_format(a));

	/* Close the archive. */
	assertEqualInt(ARCHIVE_OK, archive_read_close(a));
cleanup:
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}